

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall Inferences::ContextSubsetReplacement::stepIteration(ContextSubsetReplacement *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  puVar2 = (this->_iteration).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_iteration).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    uVar5 = lVar4 >> 2;
    puVar3 = (this->_maxIterations).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 1;
    uVar7 = 0;
    do {
      if (puVar3[uVar7] <= this->_maxOccurrences) {
        uVar1 = puVar2[uVar7];
        puVar2[uVar7] = uVar1 + 1;
        if (uVar1 + 1 < puVar3[uVar7]) {
          if (bVar8) {
            return;
          }
          break;
        }
        puVar2[uVar7] = 1;
      }
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      bVar8 = uVar7 < uVar5;
    } while (uVar7 < uVar5);
  }
  this->_done = true;
  return;
}

Assistant:

void ContextSubsetReplacement::stepIteration()
{
  for (unsigned i = 0; i < _iteration.size(); i++) {
    if (_maxIterations[i] > _maxOccurrences) {
      continue;
    }
    _iteration[i]++;
    if (_iteration[i] < _maxIterations[i]) {
      return;
    } else {
      _iteration[i] = 1;
    }
  }
  _done = true;
}